

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

unit units::root(unit *un,int power)

{
  double dVar1;
  unit_data local_24;
  unit_data local_20;
  int local_1c;
  unit *puStack_18;
  int power_local;
  unit *un_local;
  
  if (power == 0) {
    un_local = (unit *)0x3f800000;
  }
  else {
    local_1c = power;
    puStack_18 = un;
    dVar1 = unit::multiplier(un);
    if ((0.0 <= dVar1) || (local_1c % 2 != 0)) {
      dVar1 = unit::multiplier(puStack_18);
      dVar1 = numericalRoot<double>(dVar1,local_1c);
      local_24 = unit::base_units(puStack_18);
      local_20 = detail::unit_data::root(&local_24,local_1c);
      unit::unit((unit *)&un_local,dVar1,&local_20);
    }
    else {
      un_local = (unit *)0xfa94a4883f800000;
    }
  }
  return (unit)un_local;
}

Assistant:

unit root(const unit& un, int power)
{
    if (power == 0) {
        return one;
    }
    if (un.multiplier() < 0.0 && power % 2 == 0) {
        return error;
    }
    return unit{
        numericalRoot(un.multiplier(), power), un.base_units().root(power)};
}